

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocatorTest.cpp
# Opt level: O2

void __thiscall
TEST_FailableMemoryAllocator_FailThirdAllocationAtGivenLine_Test::
TEST_FailableMemoryAllocator_FailThirdAllocationAtGivenLine_Test
          (TEST_FailableMemoryAllocator_FailThirdAllocationAtGivenLine_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupFailableMemoryAllocator).stash.originalNewAllocator =
       (TestMemoryAllocator *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupFailableMemoryAllocator).stash.originalNewArrayAllocator =
       (TestMemoryAllocator *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupFailableMemoryAllocator).fixture.result_ = (TestResult *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupFailableMemoryAllocator).stash.originalMallocAllocator =
       (TestMemoryAllocator *)0x0;
  *(undefined8 *)
   &(this->super_TEST_GROUP_CppUTestGroupFailableMemoryAllocator).fixture.ownsExecFunction_ = 0;
  (this->super_TEST_GROUP_CppUTestGroupFailableMemoryAllocator).fixture.output_ =
       (StringBufferTestOutput *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupFailableMemoryAllocator).fixture.registry_ =
       (TestRegistry *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupFailableMemoryAllocator).fixture.genTest_ =
       (ExecFunctionTestShell *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupFailableMemoryAllocator).testFunction.testFunction_ =
       (_func_void_FailableMemoryAllocator_ptr *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupFailableMemoryAllocator).fixture._vptr_TestTestingFixture =
       (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupFailableMemoryAllocator).testFunction.super_ExecFunction.
  _vptr_ExecFunction = (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupFailableMemoryAllocator).testFunction.allocator_ =
       (FailableMemoryAllocator *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupFailableMemoryAllocator).super_Utest._vptr_Utest =
       (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupFailableMemoryAllocator).failableMallocAllocator =
       (FailableMemoryAllocator *)0x0;
  TEST_GROUP_CppUTestGroupFailableMemoryAllocator::TEST_GROUP_CppUTestGroupFailableMemoryAllocator
            (&this->super_TEST_GROUP_CppUTestGroupFailableMemoryAllocator);
  (this->super_TEST_GROUP_CppUTestGroupFailableMemoryAllocator).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupFailableMemoryAllocator_00388778;
  return;
}

Assistant:

TEST(FailableMemoryAllocator, FailThirdAllocationAtGivenLine)
{
    int *memory[10] = { NULLPTR };
    int allocation;
    failableMallocAllocator->failNthAllocAt(3, __FILE__, __LINE__ + 4);

    for (allocation = 1; allocation <= 10; allocation++)
    {
        memory[allocation - 1] = (int *)malloc(sizeof(int));
        if (memory[allocation - 1] == NULLPTR)
            break;
        free(memory[allocation -1]);
    }

    LONGS_EQUAL(3, allocation);
}